

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O2

int Dch_ObjMarkTfi_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 0;
  uVar4 = 0;
  do {
    if (pObj == (Aig_Obj_t *)0x0) {
LAB_004e67d0:
      return uVar3 | uVar4;
    }
    iVar1 = p->nTravIds;
    if (pObj->TravId == iVar1) goto LAB_004e67d0;
    uVar2 = (uint)*(undefined8 *)&pObj->field_0x18;
    if ((uVar2 & 7) == 2) {
      uVar3 = (uint)(pObj->TravId != iVar1 + -1);
      pObj->TravId = iVar1;
      goto LAB_004e67d0;
    }
    if ((uVar2 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchChoice.c"
                    ,0x80,"int Dch_ObjMarkTfi_rec(Aig_Man_t *, Aig_Obj_t *)");
    }
    pObj->TravId = iVar1;
    uVar2 = Dch_ObjMarkTfi_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    uVar4 = uVar4 | uVar2;
  } while( true );
}

Assistant:

int Dch_ObjMarkTfi_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    int RetValue;
    if ( pObj == NULL )
        return 0;
    if ( Aig_ObjIsTravIdCurrent( p, pObj ) )
        return 0;
    if ( Aig_ObjIsCi(pObj) )
    {
        RetValue = !Aig_ObjIsTravIdPrevious( p, pObj );
        Aig_ObjSetTravIdCurrent( p, pObj );
        return RetValue;
    }
    assert( Aig_ObjIsNode(pObj) );
    Aig_ObjSetTravIdCurrent( p, pObj );
    RetValue  = Dch_ObjMarkTfi_rec( p, Aig_ObjFanin0(pObj) );
    RetValue += Dch_ObjMarkTfi_rec( p, Aig_ObjFanin1(pObj) );
//    RetValue += Dch_ObjMarkTfi_rec( p, Aig_ObjEquiv(p, pObj) );
    return (RetValue > 0);
}